

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  uint32_t uVar1;
  _Rb_tree_color _Var2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_bool>
  pVar4;
  allocator_type local_79;
  Instruction *local_78;
  value_type_conflict3 local_6c;
  pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_78 = var;
  iVar3 = std::
          _Rb_tree<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::find(&(this->replacement_variables_)._M_t,&local_78);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = descsroautil::GetNumberOfElementsForArrayOrStruct((this->super_Pass).context_,local_78);
    local_6c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(ulong)uVar1,
               &local_6c,&local_79);
    local_68.first = local_78;
    local_68.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    local_68.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_68.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar4 = std::
            _Rb_tree<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
            ::
            _M_insert_unique<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      ((_Rb_tree<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                        *)&this->replacement_variables_,&local_68);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_68.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  _Var2 = (&(iVar3._M_node[1]._M_parent)->_M_color)[idx];
  if (_Var2 == _S_red) {
    _Var2 = CreateReplacementVariable(this,local_78,idx);
    (&(iVar3._M_node[1]._M_parent)->_M_color)[idx] = _Var2;
  }
  return _Var2;
}

Assistant:

uint32_t DescriptorScalarReplacement::GetReplacementVariable(Instruction* var,
                                                             uint32_t idx) {
  auto replacement_vars = replacement_variables_.find(var);
  if (replacement_vars == replacement_variables_.end()) {
    uint32_t number_of_elements =
        descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
    replacement_vars =
        replacement_variables_
            .insert({var, std::vector<uint32_t>(number_of_elements, 0)})
            .first;
  }

  if (replacement_vars->second[idx] == 0) {
    replacement_vars->second[idx] = CreateReplacementVariable(var, idx);
  }

  return replacement_vars->second[idx];
}